

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O3

uchar * Exomizer_crunch(uchar *input_data,int input_len,int *retlen)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  bool bVar3;
  byte bVar4;
  void *__src;
  int iVar5;
  void *__ptr;
  uint flag_char;
  char **argv;
  char *appl;
  log_ctx *ctx;
  undefined1 *puVar6;
  uchar *__dest;
  undefined1 *puVar7;
  int newlen;
  size_t __size;
  membuf outbuf [1];
  crunch_info info [1];
  common_flags flags [1];
  char flags_arr [32];
  membuf local_b8;
  int local_9c;
  membuf local_98;
  int *local_88;
  uchar *local_80;
  char *local_78;
  crunch_info local_70;
  common_flags local_68;
  char local_58 [40];
  
  local_68.options = Exomizer_crunch::options;
  local_68.outfile = "a.out";
  local_80 = input_data;
  argv = (char **)malloc(8);
  appl = strdup("mem_exomizer");
  *argv = appl;
  local_78 = fixup_appl(appl);
  ctx = log_new();
  G_log_ctx = ctx;
  ctx->level = LOG_NORMAL;
  G_log_level = LOG_NORMAL;
  log_add_output_stream(ctx,LOG_WARNING,LOG_MAX,(log_formatter_f *)0x0,_stdout);
  log_add_output_stream(G_log_ctx,LOG_MIN,~LOG_TRACE,(log_formatter_f *)0x0,_stderr);
  if (~LOG_FATAL < G_log_level) {
    G_log_log_level = LOG_DUMP;
    log_log_default("flagind %d\n",(ulong)(uint)flagind);
  }
  bVar4 = 0;
  sprintf(local_58,"bdr%s","cCe:m:M:p:o:qv");
  flag_char = getflag(1,argv,local_58);
  if (flag_char == 0xffffffff) {
    bVar3 = true;
  }
  else {
    bVar3 = false;
    bVar4 = 0;
    local_9c = input_len;
    local_88 = retlen;
    do {
      if (~LOG_FATAL < G_log_level) {
        G_log_log_level = LOG_DUMP;
        log_log_default(" flagind %d flagopt \'%c\'\n",(ulong)(uint)flagind,(ulong)flag_char);
      }
      if (flag_char == 0x62) {
        bVar3 = true;
      }
      else if (flag_char == 0x72) {
        bVar4 = 1;
      }
      else {
        handle_crunch_flags(flag_char,flagarg,print_usage,local_78,&local_68);
      }
      flag_char = getflag(1,argv,local_58);
    } while (flag_char != 0xffffffff);
    bVar3 = !bVar3;
    retlen = local_88;
    input_len = local_9c;
  }
  local_98.buf = (void *)0x0;
  local_98.len = 0;
  local_98.size = 0;
  local_b8.buf = (undefined1 *)0x0;
  local_b8.len = 0;
  local_b8.size = 0;
  membuf_atleast(&local_98,input_len);
  __ptr = local_98.buf;
  if (local_80 == (uchar *)0x0) {
    memset((void *)((long)local_98.len + (long)local_98.buf),0,(long)input_len);
  }
  else {
    memcpy((void *)((long)local_98.len + (long)local_98.buf),local_80,(long)input_len);
  }
  local_98.len = input_len;
  if (bVar3) {
    crunch(&local_98,&local_b8,Exomizer_crunch::options,&local_70);
  }
  else {
    crunch_backwards(&local_98,&local_b8,Exomizer_crunch::options,&local_70);
  }
  __src = local_b8.buf;
  iVar5 = local_b8.len;
  puVar6 = (undefined1 *)((long)local_b8.buf + (long)local_b8.len + -1);
  puVar2 = (undefined1 *)local_b8.buf;
  if ((bool)(bVar4 & local_b8.buf < puVar6)) {
    do {
      puVar7 = puVar2 + 1;
      uVar1 = *puVar2;
      *puVar2 = *puVar6;
      *puVar6 = uVar1;
      puVar6 = puVar6 + -1;
      puVar2 = puVar7;
    } while (puVar7 < puVar6);
  }
  __size = (size_t)local_b8.len;
  __dest = (uchar *)malloc(__size);
  memcpy(__dest,__src,__size);
  *retlen = iVar5;
  if ((undefined1 *)__src != (undefined1 *)0x0) {
    free(__src);
    local_b8.buf = (undefined1 *)0x0;
  }
  local_b8.len = 0;
  local_b8.size = 0;
  if (__ptr != (void *)0x0) {
    free(__ptr);
  }
  log_delete(G_log_ctx);
  return __dest;
}

Assistant:

unsigned char *Exomizer_crunch(unsigned char *input_data, int input_len, int *retlen)
{
	int argc=1;
	char **argv=NULL;
    char flags_arr[32];
    int decrunch_mode = 0;
    int backwards_mode = 0;
    int reverse_mode = 0;
    int c, infilec;
    char **infilev;
	/* output buffer */
	unsigned char *output_data;

    static struct crunch_options options[1] = { CRUNCH_OPTIONS_DEFAULT };
    struct common_flags flags[1] = { {options, DEFAULT_OUTFILE} };

    struct membuf inbuf[1];
    struct membuf outbuf[1];

    const char *appl;;


	argv=malloc(sizeof(char *));
	argv[0]=strdup("mem_exomizer");
    /* init args */
    appl = fixup_appl(argv[0]);

    /* init logging */
    LOG_INIT_CONSOLE(LOG_NORMAL);

    LOG(LOG_DUMP, ("flagind %d\n", flagind));
    sprintf(flags_arr, "bdr%s", CRUNCH_FLAGS);
    while ((c = getflag(argc, argv, flags_arr)) != -1)
    {
        LOG(LOG_DUMP, (" flagind %d flagopt '%c'\n", flagind, c));
        switch (c)
        {
        case 'b':
            backwards_mode = 1;
            break;
        case 'r':
            reverse_mode = 1;
            break;
        default:
            handle_crunch_flags(c, flagarg, print_usage, appl, flags);
        }
    }

    infilev = argv + flagind;
    infilec = argc - flagind;

	/* only memory */
    if (0) if (infilec != 1)
    {
        LOG(LOG_ERROR, ("Error: exactly one input file must be given.\n"));
        print_usage(appl, LOG_NORMAL, DEFAULT_OUTFILE);
        exit(-1);
    }

    membuf_init(inbuf);
    membuf_init(outbuf);

	/* rustine */
    //read_file(infilev[0], inbuf);
	//void read_file(const char *name, struct membuf *buf)
#if 0
	{
    char block[1024];
    FILE *in;
    int len;

    in = fopen(name, "rb");
    if(in == NULL)
    {
        LOG(LOG_ERROR, ("Can't open file \"%s\" for input.\n", name));
        exit(-1);
    }
    do
    {
        len = fread(block, 1, 1024, in);
        membuf_append(buf, block, len);
    }
    while(len == 1024);
    LOG(LOG_DEBUG, ("read %d bytes from file\n", len));
    fclose(in);
	}
#endif
	
	membuf_append(inbuf, input_data, input_len);
	
	
    {
        struct crunch_info info[1];
        if(backwards_mode)
        {
            //JLOG(LOG_NORMAL, ("Crunching infile \"%s\" to outfile \"%s\" " "backwards.\n", infilev[0], flags->outfile));
            crunch_backwards(inbuf, outbuf, options, info);
        }
        else
        {
            //LOG(LOG_NORMAL, ("Crunching infile \"%s\" to outfile \"%s\".\n", infilev[0], flags->outfile));
            crunch(inbuf, outbuf, options, info);
        }

        //LOG(LOG_NORMAL, (" Literal sequences are %sused and", info->literal_sequences_used ? "" : "not "));
        //LOG(LOG_NORMAL, ("Mizoumizer info: the safety offset is %d.\n", info->needed_safety_offset));

    }

    if(reverse_mode)
    {
        reverse_buffer(membuf_get(outbuf), membuf_memlen(outbuf));
    }
	
#if 0	
    //write_file(flags->outfile, outbuf);
	//void write_file(const char *name, struct membuf *buf)
	{
    FILE *out;
    out = fopen(flags->outfile, "wb");
    if(out == NULL)
    {
        LOG(LOG_ERROR, ("Can't open file \"%s\" for output.\n", name));
        exit(-1);
    }
    fwrite(, 1, membuf_memlen(outbuf), out);
    fclose(out);
	}
#endif

	output_data=MemMalloc(membuf_memlen(outbuf));
	memcpy(output_data,membuf_get(outbuf),membuf_memlen(outbuf));
	*retlen=membuf_memlen(outbuf);
	
    membuf_free(outbuf);
    membuf_free(inbuf);

    LOG_FREE;

    return output_data;
}